

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  type_conflict5 tVar1;
  char *pcVar2;
  int *piVar3;
  cpp_dec_float<50U,_int,_void> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar4;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  int i_1;
  int i;
  int idx;
  int enterIdx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leastBest;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *coWeights_ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *coTest;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  undefined4 in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbc8;
  undefined1 local_408 [56];
  undefined1 local_3d0 [8];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc48;
  undefined1 local_398 [56];
  undefined1 local_360 [56];
  uint local_328;
  undefined4 local_324;
  undefined1 local_320 [56];
  undefined1 local_2e8 [56];
  undefined1 local_2b0 [56];
  undefined1 local_278 [56];
  undefined1 local_240 [56];
  uint local_208;
  int local_204;
  int local_200;
  undefined1 local_1fc [56];
  undefined4 local_1c4;
  undefined1 local_1c0 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined8 local_170;
  DataKey local_160;
  undefined8 local_158;
  undefined4 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  undefined1 *local_120;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined4 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  cpp_dec_float<50U,_int,_void> *local_58;
  undefined1 *local_50;
  cpp_dec_float<50U,_int,_void> *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  cpp_dec_float<50U,_int,_void> *local_28;
  undefined1 *local_20;
  cpp_dec_float<50U,_int,_void> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_170 = in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::coTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **)((in_RDI->m_backend).data._M_elems + 4));
  local_180 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x3b7d72);
  local_188 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x3b7d92);
  local_1c4 = 0xffffffff;
  local_148 = local_1c0;
  local_150 = &local_1c4;
  local_158 = 0;
  local_68 = local_150;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),(longlong)in_RDI,in_RDX);
  local_140 = local_1fc;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDX);
  local_200 = -1;
  local_208 = IdxSet::size((IdxSet *)(in_RDI[5].m_backend.data._M_elems + 8));
  uVar4 = extraout_RDX;
  while (local_208 = local_208 - 1, -1 < (int)local_208) {
    pcVar2 = IdxSet::index((IdxSet *)(in_RDI[5].m_backend.data._M_elems + 8),
                           (char *)(ulong)local_208,(int)uVar4);
    local_204 = (int)pcVar2;
    local_78 = local_180 + local_204;
    local_70 = local_1fc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    local_20 = local_240;
    local_28 = in_RDX;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_RDX);
    local_10 = local_240;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    local_8 = local_240;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(in_RDX);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3b7f4a);
    if (tVar1) {
      local_130 = local_2b0;
      local_138 = local_1fc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_128 = local_188 + local_204;
      local_120 = local_2e8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_110 = local_320;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_c0 = local_1fc;
      local_c8 = local_278;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b806d);
      if (tVar1) {
        local_80 = local_170;
        local_88 = local_1fc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        local_200 = local_204;
      }
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b80cb);
      in_stack_fffffffffffffbac = CONCAT13(1,(int3)in_stack_fffffffffffffbac);
      uVar4 = extraout_RDX_00;
      if (!tVar1) {
        local_324 = 0;
        tVar1 = boost::multiprecision::operator<(in_RDI,(int *)in_RDX);
        in_stack_fffffffffffffbac = CONCAT13(tVar1,(int3)in_stack_fffffffffffffbac);
        uVar4 = extraout_RDX_01;
      }
      if ((char)((uint)in_stack_fffffffffffffbac >> 0x18) != '\0') {
        local_90 = local_1c0;
        local_98 = local_1fc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        uVar4 = extraout_RDX_02;
      }
    }
    else {
      IdxSet::remove((IdxSet *)(in_RDI[5].m_backend.data._M_elems + 8),(char *)(ulong)local_208);
      piVar3 = DataArray<int>::operator[]
                         ((DataArray<int> *)
                          (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcf8),local_204);
      *piVar3 = 0;
      uVar4 = extraout_RDX_03;
    }
  }
  local_328 = IdxSet::size((IdxSet *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcb8));
  uVar4 = extraout_RDX_04;
  while (local_328 = local_328 - 1, -1 < (int)local_328) {
    pcVar2 = IdxSet::index((IdxSet *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcb8),
                           (char *)(ulong)local_328,(int)uVar4);
    local_204 = (int)pcVar2;
    piVar3 = DataArray<int>::operator[]
                       ((DataArray<int> *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcf8)
                        ,local_204);
    uVar4 = extraout_RDX_05;
    if (*piVar3 == 1) {
      local_a8 = local_180 + local_204;
      local_a0 = local_1fc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_50 = local_360;
      local_58 = in_RDX;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_59,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_RDX);
      local_40 = local_360;
      local_48 = local_58;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_38 = local_360;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(in_RDX);
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b82e3);
      if (tVar1) {
        local_100 = local_3d0;
        local_108 = local_1fc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        local_f8 = local_188 + local_204;
        local_f0 = local_408;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        local_e0 = &stack0xfffffffffffffbc0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        local_d0 = local_1fc;
        local_d8 = local_398;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        tVar1 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3b83fa);
        uVar4 = extraout_RDX_06;
        if (tVar1) {
          tVar1 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x3b8418);
          if (tVar1) {
            local_b0 = local_170;
            local_b8 = local_1fc;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                              CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            local_200 = local_204;
          }
          piVar3 = DataArray<int>::operator[]
                             ((DataArray<int> *)
                              (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcf8),local_204);
          *piVar3 = 2;
          DIdxSet::addIdx((DIdxSet *)in_RDX,in_stack_fffffffffffffbac);
          uVar4 = extraout_RDX_07;
        }
      }
      else {
        piVar3 = DataArray<int>::operator[]
                           ((DataArray<int> *)
                            (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcf8),local_204);
        *piVar3 = 0;
        uVar4 = extraout_RDX_08;
      }
    }
  }
  if (local_200 < 0) {
    SPxId::SPxId((SPxId *)0x3b850f);
  }
  else {
    local_160 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::coId(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4);
  }
  return (SPxId)local_160;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterHyperDim(R& best, R tol)
{
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = coTest[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indices that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = coTest[idx];

         if(x < -tol)
         {
            x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
               }

               // put index into candidate list
               this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
               bestPrices.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);
   else
      return SPxId();
}